

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void roundsd_(PDISASM pMyDisasm)

{
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if (((pMyDisasm->Reserved_).VEX.pp == '\x01') && ((pMyDisasm->Reserved_).EVEX.W == '\0')) {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vrndscalesd",0xc);
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
LAB_0012de3b:
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
      (pMyDisasm->Reserved_).MemDecoration = 0xcc;
      return;
    }
  }
  else if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vroundsd",9);
      goto LAB_0012de3b;
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Instruction).Category = 0x8002b;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"roundsd",8);
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    return;
  }
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ roundsd_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrndscalesd");
        #endif
        GV.EVEX.tupletype = TUPLE1_SCALAR;
        ArgsVEX(pMyDisasm);
        getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
        GV.MemDecoration = Arg3qword;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vroundsd");
      #endif
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
      GV.MemDecoration = Arg3qword;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       GV.MemDecoration = Arg2qword;
       pMyDisasm->Instruction.Category = SSE41_INSTRUCTION+ROUND_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "roundsd");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);

       getImmediat8(&pMyDisasm->Operand3, pMyDisasm);

   }
   else {
       failDecode(pMyDisasm);
   }
}